

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::print_attr_metas_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,AttrMeta *meta,uint32_t indent)

{
  tinyusdz *ptVar1;
  string *psVar2;
  ostream *poVar3;
  long *plVar4;
  size_type *psVar5;
  bool v;
  Interpolation interp;
  uint32_t v_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  token *v_01;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  token *v_02;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  undefined8 extraout_RDX_15;
  undefined8 extraout_RDX_16;
  undefined8 extraout_RDX_17;
  undefined8 extraout_RDX_18;
  undefined8 extraout_RDX_19;
  undefined8 extraout_RDX_20;
  undefined8 extraout_RDX_21;
  undefined8 extraout_RDX_22;
  undefined8 extraout_RDX_23;
  undefined8 extraout_RDX_24;
  undefined8 extraout_RDX_25;
  token *v_03;
  undefined8 extraout_RDX_26;
  undefined8 extraout_RDX_27;
  undefined8 extraout_RDX_28;
  undefined8 extraout_RDX_29;
  undefined8 extraout_RDX_30;
  token *v_04;
  undefined8 extraout_RDX_31;
  undefined8 extraout_RDX_32;
  undefined8 extraout_RDX_33;
  undefined8 extraout_RDX_34;
  undefined8 extraout_RDX_35;
  undefined8 extraout_RDX_36;
  undefined8 extraout_RDX_37;
  undefined8 extraout_RDX_38;
  undefined8 extraout_RDX_39;
  undefined8 extraout_RDX_40;
  undefined8 extraout_RDX_41;
  undefined8 extraout_RDX_42;
  StringData *v_05;
  undefined8 extraout_RDX_43;
  undefined8 extraout_RDX_44;
  undefined8 extraout_RDX_45;
  undefined8 extraout_RDX_46;
  undefined8 extraout_RDX_47;
  undefined8 extraout_RDX_48;
  undefined8 extraout_RDX_49;
  undefined8 extraout_RDX_50;
  undefined8 extraout_RDX_51;
  StringData *v_06;
  undefined8 extraout_RDX_52;
  undefined8 extraout_RDX_53;
  undefined8 extraout_RDX_54;
  undefined8 uVar6;
  _Rb_tree_node_base *p_Var7;
  char *pcVar8;
  uint32_t indent_00;
  pprint *this_00;
  StringData *item;
  tinyusdz *this_01;
  undefined1 auVar9 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  stringstream ss;
  string local_260;
  string local_240;
  string local_220;
  long *local_200;
  long local_1f8;
  long local_1f0 [2];
  string local_1e0;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  indent_00 = (uint32_t)meta;
  uVar6 = extraout_RDX;
  if (*this == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_
              (&local_220,(pprint *)((ulong)meta & 0xffffffff),(uint32_t)extraout_RDX);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"interpolation = ",0x10);
    if (*this == (tinyusdz)0x0) {
      pcVar8 = 
      "const value_type &nonstd::optional_lite::optional<tinyusdz::Interpolation>::value() const [T = tinyusdz::Interpolation]"
      ;
      goto LAB_001f78bb;
    }
    to_string_abi_cxx11_(&local_1e0,(tinyusdz *)(ulong)*(uint *)(this + 4),interp);
    local_200 = local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"\"","");
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_240,local_200,local_1f8 + (long)local_200);
    std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_1e0._M_dataplus._M_p);
    plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_200);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_260.field_2._M_allocated_capacity = *psVar5;
      local_260.field_2._8_8_ = plVar4[3];
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    }
    else {
      local_260.field_2._M_allocated_capacity = *psVar5;
      local_260._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_260._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_260._M_dataplus._M_p,local_260._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    uVar6 = extraout_RDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_01;
    }
    if (local_200 != local_1f0) {
      operator_delete(local_200,local_1f0[0] + 1);
      uVar6 = extraout_RDX_02;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_03;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_04;
    }
  }
  if (this[8] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_(&local_240,(pprint *)((ulong)meta & 0xffffffff),(uint32_t)uVar6);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_240._M_dataplus._M_p,local_240._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"elementSize = ",0xe);
    if (this[8] == (tinyusdz)0x0) {
      pcVar8 = 
      "const value_type &nonstd::optional_lite::optional<unsigned int>::value() const [T = unsigned int]"
      ;
      goto LAB_001f78bb;
    }
    to_string_abi_cxx11_(&local_220,(tinyusdz *)(ulong)*(uint *)(this + 0xc),v_00);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_220._M_dataplus._M_p,local_220._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    uVar6 = extraout_RDX_05;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_06;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_07;
    }
  }
  if (this[0x198] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_(&local_220,(pprint *)((ulong)meta & 0xffffffff),(uint32_t)uVar6);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"bindMaterialAs = ",0x11);
    if (this[0x198] != (tinyusdz)0x0) {
      to_string_abi_cxx11_(&local_1e0,this + 0x1a0,v_01);
      local_200 = local_1f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"\"","");
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_240,local_200,local_1f8 + (long)local_200);
      std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_1e0._M_dataplus._M_p);
      plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_200);
      psVar5 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_260.field_2._M_allocated_capacity = *psVar5;
        local_260.field_2._8_8_ = plVar4[3];
        local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
      }
      else {
        local_260.field_2._M_allocated_capacity = *psVar5;
        local_260._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_260._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_260._M_dataplus._M_p,local_260._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      uVar6 = extraout_RDX_08;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
        uVar6 = extraout_RDX_09;
      }
      if (local_200 != local_1f0) {
        operator_delete(local_200,local_1f0[0] + 1);
        uVar6 = extraout_RDX_10;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        uVar6 = extraout_RDX_11;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        uVar6 = extraout_RDX_12;
      }
      goto LAB_001f6a13;
    }
LAB_001f77ff:
    pcVar8 = 
    "const value_type &nonstd::optional_lite::optional<tinyusdz::Token>::value() const [T = tinyusdz::Token]"
    ;
LAB_001f78bb:
    __assert_fail("has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                  ,0x584,pcVar8);
  }
LAB_001f6a13:
  if (this[0x98] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_(&local_220,(pprint *)((ulong)meta & 0xffffffff),(uint32_t)uVar6);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"connectability = ",0x11);
    if (this[0x98] == (tinyusdz)0x0) goto LAB_001f77ff;
    to_string_abi_cxx11_(&local_1e0,this + 0xa0,v_02);
    local_200 = local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"\"","");
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_240,local_200,local_1f8 + (long)local_200);
    std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_1e0._M_dataplus._M_p);
    plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_200);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_260.field_2._M_allocated_capacity = *psVar5;
      local_260.field_2._8_8_ = plVar4[3];
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    }
    else {
      local_260.field_2._M_allocated_capacity = *psVar5;
      local_260._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_260._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_260._M_dataplus._M_p,local_260._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    uVar6 = extraout_RDX_13;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_14;
    }
    if (local_200 != local_1f0) {
      operator_delete(local_200,local_1f0[0] + 1);
      uVar6 = extraout_RDX_15;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_16;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_17;
    }
  }
  if (this[0x148] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_(&local_220,(pprint *)((ulong)meta & 0xffffffff),(uint32_t)uVar6);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"displayName = ",0xe);
    if (this[0x148] != (tinyusdz)0x0) {
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"\"","");
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_240,local_1e0._M_dataplus._M_p,
                 local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
      std::__cxx11::string::_M_append((char *)&local_240,*(ulong *)(this + 0x150));
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_240,(ulong)local_1e0._M_dataplus._M_p);
      psVar5 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_260.field_2._M_allocated_capacity = *psVar5;
        local_260.field_2._8_8_ = plVar4[3];
        local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
      }
      else {
        local_260.field_2._M_allocated_capacity = *psVar5;
        local_260._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_260._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_260._M_dataplus._M_p,local_260._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      uVar6 = extraout_RDX_18;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
        uVar6 = extraout_RDX_19;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        uVar6 = extraout_RDX_20;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        uVar6 = extraout_RDX_21;
      }
      goto LAB_001f6d7f;
    }
LAB_001f7819:
    pcVar8 = 
    "const value_type &nonstd::optional_lite::optional<std::basic_string<char>>::value() const [T = std::basic_string<char>]"
    ;
    goto LAB_001f78bb;
  }
LAB_001f6d7f:
  if (this[0x170] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_(&local_220,(pprint *)((ulong)meta & 0xffffffff),(uint32_t)uVar6);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"displayGroup = ",0xf);
    if (this[0x170] == (tinyusdz)0x0) goto LAB_001f7819;
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"\"","");
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_240,local_1e0._M_dataplus._M_p,
               local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
    std::__cxx11::string::_M_append((char *)&local_240,*(ulong *)(this + 0x178));
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_240,(ulong)local_1e0._M_dataplus._M_p);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_260.field_2._M_allocated_capacity = *psVar5;
      local_260.field_2._8_8_ = plVar4[3];
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    }
    else {
      local_260.field_2._M_allocated_capacity = *psVar5;
      local_260._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_260._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_260._M_dataplus._M_p,local_260._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    uVar6 = extraout_RDX_22;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_23;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_24;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_25;
    }
  }
  if (this[0xc0] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_(&local_220,(pprint *)((ulong)meta & 0xffffffff),(uint32_t)uVar6);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"outputName = ",0xd);
    if (this[0xc0] == (tinyusdz)0x0) goto LAB_001f77ff;
    to_string_abi_cxx11_(&local_1e0,this + 200,v_03);
    local_200 = local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"\"","");
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_240,local_200,local_1f8 + (long)local_200);
    std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_1e0._M_dataplus._M_p);
    plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_200);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_260.field_2._M_allocated_capacity = *psVar5;
      local_260.field_2._8_8_ = plVar4[3];
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    }
    else {
      local_260.field_2._M_allocated_capacity = *psVar5;
      local_260._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_260._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_260._M_dataplus._M_p,local_260._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    uVar6 = extraout_RDX_26;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_27;
    }
    if (local_200 != local_1f0) {
      operator_delete(local_200,local_1f0[0] + 1);
      uVar6 = extraout_RDX_28;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_29;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_30;
    }
  }
  if (this[0xe8] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_(&local_220,(pprint *)((ulong)meta & 0xffffffff),(uint32_t)uVar6);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"renderType = ",0xd);
    if (this[0xe8] == (tinyusdz)0x0) goto LAB_001f77ff;
    to_string_abi_cxx11_(&local_1e0,this + 0xf0,v_04);
    local_200 = local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"\"","");
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_240,local_200,local_1f8 + (long)local_200);
    std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_1e0._M_dataplus._M_p);
    plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_200);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_260.field_2._M_allocated_capacity = *psVar5;
      local_260.field_2._8_8_ = plVar4[3];
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    }
    else {
      local_260.field_2._M_allocated_capacity = *psVar5;
      local_260._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_260._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_260._M_dataplus._M_p,local_260._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    uVar6 = extraout_RDX_31;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_32;
    }
    if (local_200 != local_1f0) {
      operator_delete(local_200,local_1f0[0] + 1);
      uVar6 = extraout_RDX_33;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_34;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_35;
    }
  }
  this_00 = (pprint *)((ulong)meta & 0xffffffff);
  if (this[0x110] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_(&local_240,this_00,(uint32_t)uVar6);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_240._M_dataplus._M_p,local_240._M_string_length);
    if (this[0x110] == (tinyusdz)0x0) {
      pcVar8 = 
      "const value_type &nonstd::optional_lite::optional<std::map<std::basic_string<char>, tinyusdz::MetaVariable>>::value() const [T = std::map<std::basic_string<char>, tinyusdz::MetaVariable>]"
      ;
      goto LAB_001f78bb;
    }
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"sdrMetadata","");
    print_customData(&local_220,(CustomDataType *)(this + 0x118),&local_260,indent_00);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,local_220._M_dataplus._M_p,local_220._M_string_length);
    uVar6 = extraout_RDX_36;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_37;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_38;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_39;
    }
  }
  if (this[0x10] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_(&local_240,this_00,(uint32_t)uVar6);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_240._M_dataplus._M_p,local_240._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"hidden = ",9);
    if (this[0x10] == (tinyusdz)0x0) {
      pcVar8 = "const value_type &nonstd::optional_lite::optional<bool>::value() const [T = bool]";
      goto LAB_001f78bb;
    }
    to_string_abi_cxx11_(&local_220,(tinyusdz *)(ulong)(byte)this[0x11],v);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_220._M_dataplus._M_p,local_220._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    uVar6 = extraout_RDX_40;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_41;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_42;
    }
  }
  if (this[0x18] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_(&local_240,this_00,(uint32_t)uVar6);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_240._M_dataplus._M_p,local_240._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"comment = ",10);
    if (this[0x18] == (tinyusdz)0x0) {
      pcVar8 = 
      "const value_type &nonstd::optional_lite::optional<tinyusdz::value::StringData>::value() const [T = tinyusdz::value::StringData]"
      ;
      goto LAB_001f78bb;
    }
    to_string_abi_cxx11_(&local_220,this + 0x20,v_05);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_220._M_dataplus._M_p,local_220._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    uVar6 = extraout_RDX_43;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_44;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_45;
    }
  }
  if (this[0x88] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_(&local_240,this_00,(uint32_t)uVar6);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_240._M_dataplus._M_p,local_240._M_string_length);
    pcVar8 = "weight = ";
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"weight = ",9);
    if (this[0x88] == (tinyusdz)0x0) {
      pcVar8 = 
      "const value_type &nonstd::optional_lite::optional<double>::value() const [T = double]";
      goto LAB_001f78bb;
    }
    (anonymous_namespace)::dtos_abi_cxx11_
              (&local_220,(_anonymous_namespace_ *)pcVar8,*(double *)(this + 0x90));
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_220._M_dataplus._M_p,local_220._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    uVar6 = extraout_RDX_46;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_47;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_48;
    }
  }
  if (this[0x50] == (tinyusdz)0x1) {
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"customData","");
    print_customData(&local_240,(CustomDataType *)(this + 0x58),&local_220,indent_00);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_240._M_dataplus._M_p,local_240._M_string_length);
    uVar6 = extraout_RDX_49;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_50;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_51;
    }
  }
  p_Var7 = *(_Rb_tree_node_base **)(this + 0x1d8);
  if (p_Var7 != (_Rb_tree_node_base *)(this + 0x1c8)) {
    do {
      print_meta(&local_240,(MetaVariable *)(p_Var7 + 2),indent_00,false,(string *)(p_Var7 + 1));
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_240._M_dataplus._M_p,local_240._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      auVar9 = std::_Rb_tree_increment(p_Var7);
      uVar6 = auVar9._8_8_;
      p_Var7 = auVar9._0_8_;
    } while (p_Var7 != (_Rb_tree_node_base *)(this + 0x1c8));
  }
  this_01 = *(tinyusdz **)(this + 0x1f0);
  ptVar1 = *(tinyusdz **)(this + 0x1f8);
  if (this_01 != ptVar1) {
    do {
      pprint::Indent_abi_cxx11_(&local_240,(pprint *)((ulong)meta & 0xffffffff),(uint32_t)uVar6);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_240._M_dataplus._M_p,local_240._M_string_length);
      to_string_abi_cxx11_(&local_220,this_01,v_06);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_220._M_dataplus._M_p,local_220._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      uVar6 = extraout_RDX_52;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        uVar6 = extraout_RDX_53;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        uVar6 = extraout_RDX_54;
      }
      this_01 = this_01 + 0x30;
    } while (this_01 != ptVar1);
  }
  psVar2 = local_1c0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

std::string print_attr_metas(const AttrMeta &meta, const uint32_t indent) {
  std::stringstream ss;

  if (meta.interpolation) {
    ss << pprint::Indent(indent)
       << "interpolation = " << quote(to_string(meta.interpolation.value()))
       << "\n";
  }

  if (meta.elementSize) {
    ss << pprint::Indent(indent)
       << "elementSize = " << to_string(meta.elementSize.value()) << "\n";
  }

  if (meta.bindMaterialAs) {
    ss << pprint::Indent(indent)
       << "bindMaterialAs = " << quote(to_string(meta.bindMaterialAs.value()))
       << "\n";
  }

  if (meta.connectability) {
    ss << pprint::Indent(indent)
       << "connectability = " << quote(to_string(meta.connectability.value()))
       << "\n";
  }

  if (meta.displayName) {
    ss << pprint::Indent(indent)
       << "displayName = " << quote(meta.displayName.value()) << "\n";
  }

  if (meta.displayGroup) {
    ss << pprint::Indent(indent)
       << "displayGroup = " << quote(meta.displayGroup.value()) << "\n";
  }

  if (meta.outputName) {
    ss << pprint::Indent(indent)
       << "outputName = " << quote(to_string(meta.outputName.value())) << "\n";
  }

  if (meta.renderType) {
    ss << pprint::Indent(indent)
       << "renderType = " << quote(to_string(meta.renderType.value())) << "\n";
  }

  if (meta.sdrMetadata) {
    ss << pprint::Indent(indent)
       << print_customData(meta.sdrMetadata.value(), "sdrMetadata", indent);
  }

  if (meta.hidden) {
    ss << pprint::Indent(indent)
       << "hidden = " << to_string(meta.hidden.value()) << "\n";
  }

  if (meta.comment) {
    ss << pprint::Indent(indent)
       << "comment = " << to_string(meta.comment.value()) << "\n";
  }

  if (meta.weight) {
    ss << pprint::Indent(indent) << "weight = " << dtos(meta.weight.value())
       << "\n";
  }

  if (meta.customData) {
    ss << print_customData(meta.customData.value(), "customData", indent);
  }

  // other user defined metadataum.
  for (const auto &item : meta.meta) {
    // attribute meta does not emit type_name
    ss << print_meta(item.second, indent, /* emit_type_name */false, item.first);
  }

  for (const auto &item : meta.stringData) {
    ss << pprint::Indent(indent) << to_string(item) << "\n";
  }

  return ss.str();
}